

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::PopulateSourcesInterface
          (cmExportFileGenerator *this,cmTargetExport *tei,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  char *__s;
  mapped_type *pmVar2;
  allocator<char> local_71;
  string prepro;
  string local_50;
  
  if (preprocessRule == InstallInterface) {
    this_00 = tei->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prepro,"INTERFACE_SOURCES",(allocator<char> *)&local_50);
    __s = cmGeneratorTarget::GetProperty(this_00,&prepro);
    std::__cxx11::string::~string((string *)&prepro);
    if (__s != (char *)0x0) {
      if (*__s == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&prepro,"INTERFACE_SOURCES",(allocator<char> *)&local_50);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&prepro);
        pmVar2->_M_string_length = 0;
        *(pmVar2->_M_dataplus)._M_p = '\0';
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_71);
        cmGeneratorExpression::Preprocess(&prepro,&local_50,InstallInterface,true);
        std::__cxx11::string::~string((string *)&local_50);
        if (prepro._M_string_length != 0) {
          ResolveTargetsInGeneratorExpressions
                    (this,&prepro,this_00,missingTargets,NoReplaceFreeTargets);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"INTERFACE_SOURCES",&local_71);
          bVar1 = checkInterfaceDirs(&prepro,this_00,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"INTERFACE_SOURCES",&local_71);
            pmVar2 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](properties,&local_50);
            std::__cxx11::string::_M_assign((string *)pmVar2);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
      }
      std::__cxx11::string::~string((string *)&prepro);
    }
    return;
  }
  __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmExportFileGenerator.cxx"
                ,0x154,
                "void cmExportFileGenerator::PopulateSourcesInterface(cmTargetExport *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, std::vector<std::string> &)"
               );
}

Assistant:

void cmExportFileGenerator::PopulateSourcesInterface(
  cmTargetExport* tei, cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties, std::vector<std::string>& missingTargets)
{
  cmGeneratorTarget* gt = tei->Target;
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char* propName = "INTERFACE_SOURCES";
  const char* input = gt->GetProperty(propName);

  if (!input) {
    return;
  }

  if (!*input) {
    properties[propName].clear();
    return;
  }

  std::string prepro =
    cmGeneratorExpression::Preprocess(input, preprocessRule, true);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, gt, missingTargets);

    if (!checkInterfaceDirs(prepro, gt, propName)) {
      return;
    }
    properties[propName] = prepro;
  }
}